

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_mem.c
# Opt level: O2

AliasRet aa_uref(IRIns *refa,IRIns *refb)

{
  AliasRet AVar1;
  
  AVar1 = ALIAS_NO;
  if ((refa->field_1).o == (refb->field_1).o) {
    if ((refa->field_0).op1 == (refb->field_0).op1) {
      return (uint)((refa->field_0).op2 == (refb->field_0).op2) * 2;
    }
    AVar1 = (AliasRet)((char)(refb->field_0).op2 == (char)(refa->field_0).op2);
  }
  return AVar1;
}

Assistant:

static AliasRet aa_uref(IRIns *refa, IRIns *refb)
{
  if (refa->o != refb->o)
    return ALIAS_NO;  /* Different UREFx type. */
  if (refa->op1 == refb->op1) {  /* Same function. */
    if (refa->op2 == refb->op2)
      return ALIAS_MUST;  /* Same function, same upvalue idx. */
    else
      return ALIAS_NO;  /* Same function, different upvalue idx. */
  } else {  /* Different functions, check disambiguation hash values. */
    if (((refa->op2 ^ refb->op2) & 0xff))
      return ALIAS_NO;  /* Upvalues with different hash values cannot alias. */
    else
      return ALIAS_MAY;  /* No conclusion can be drawn for same hash value. */
  }
}